

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O0

string * CppEphem::StrOpt::join_angle_abi_cxx11_
                   (vector<double,_std::allocator<double>_> *values,char *delim)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  _Setprecision _Var3;
  const_reference pvVar4;
  size_type sVar5;
  ostream *poVar6;
  char *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  string *in_RDI;
  ostringstream ss;
  double sec;
  ostringstream local_198 [376];
  value_type local_20;
  char *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,2);
  local_20 = *pvVar4;
  sVar5 = std::vector<double,_std::allocator<double>_>::size(local_10);
  if (sVar5 == 4) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,3);
    local_20 = *pvVar4 + local_20;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  _Var1 = std::setfill<char>('0');
  poVar6 = std::operator<<(local_198,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar6 = std::operator<<(poVar6,_Var2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,0);
  std::ostream::operator<<(poVar6,(int)*pvVar4);
  std::operator<<((ostream *)local_198,*local_18);
  _Var1 = std::setfill<char>('0');
  poVar6 = std::operator<<(local_198,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar6 = std::operator<<(poVar6,_Var2);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
  std::ostream::operator<<(poVar6,(int)*pvVar4);
  std::operator<<((ostream *)local_198,*local_18);
  _Var1 = std::setfill<char>('0');
  poVar6 = std::operator<<(local_198,_Var1._M_c);
  _Var2 = std::setw(0xb);
  poVar6 = std::operator<<(poVar6,_Var2);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::fixed);
  _Var3 = std::setprecision(8);
  poVar6 = std::operator<<(poVar6,_Var3);
  std::ostream::operator<<(poVar6,local_20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return in_RDI;
}

Assistant:

std::string CppEphem::StrOpt::join_angle(const std::vector<double>& values,
                                         const char&                delim)
{
    // Make sure there are only three values
    double sec = values[2];
    if (values.size() == 4) {
        sec += values[3];
    }

    // Assemble the string using the specified delimiter
    std::ostringstream ss;
    ss << std::setfill('0') << std::setw(2) << int(values[0]);
    ss << delim;
    ss << std::setfill('0') << std::setw(2) << int(values[1]);
    ss << delim;
    ss << std::setfill('0') << std::setw(11) << std::fixed 
       << std::setprecision(8) << sec;
    
    return std::string(ss.str());
}